

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::StartAny
          (AnyWriter *this,DataPiece *value)

{
  pointer pcVar1;
  TypeInfo *pTVar2;
  size_t size;
  ProtoStreamObjectWriter *pPVar3;
  StringPiece value_00;
  undefined4 uVar4;
  int iVar5;
  iterator iVar7;
  ProtoStreamObjectWriter *this_00;
  ulong uVar8;
  TypeRenderer *pp_Var9;
  pointer pEVar10;
  ulong uVar11;
  long lVar12;
  StringPiece SVar13;
  StringPiece type_name;
  StringPiece type_name_00;
  undefined1 local_78 [8];
  StatusOr<const_google::protobuf::Type_*> resolved_type;
  undefined1 local_40 [16];
  char *pcVar6;
  
  if (value->type_ == TYPE_STRING) {
    SVar13 = DataPiece::str(value);
    pcVar6 = SVar13.ptr_;
    if (pcVar6 == (char *)0x0) {
      local_78 = (undefined1  [8])&resolved_type.status_.error_message_;
      resolved_type.status_.error_code_ = OK;
      resolved_type.status_._4_4_ = 0;
      resolved_type.status_.error_message_._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      local_78 = (undefined1  [8])&resolved_type.status_.error_message_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,pcVar6,pcVar6 + SVar13.length_);
    }
    std::__cxx11::string::operator=((string *)&this->type_url_,(string *)local_78);
    if (local_78 != (undefined1  [8])&resolved_type.status_.error_message_) {
      operator_delete((void *)local_78);
    }
  }
  else {
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78,value);
    uVar4 = local_78._0_4_;
    if (local_78._0_4_ == OK) {
      std::__cxx11::string::_M_assign((string *)&this->type_url_);
    }
    else {
      pPVar3 = this->parent_;
      SVar13.length_._0_1_ = resolved_type.status_.error_message_._M_dataplus._M_p._0_1_;
      SVar13.ptr_ = (char *)resolved_type.status_._0_8_;
      SVar13.length_._1_7_ = resolved_type.status_.error_message_._M_dataplus._M_p._1_7_;
      if (resolved_type.status_.error_message_._M_dataplus._M_p._1_7_ < 0) {
        StringPiece::LogFatalSizeTooBig
                  (CONCAT71(resolved_type.status_.error_message_._M_dataplus._M_p._1_7_,
                            resolved_type.status_.error_message_._M_dataplus._M_p._0_1_),
                   "size_t to int conversion");
      }
      type_name.length_ = 6;
      type_name.ptr_ = "String";
      ProtoWriter::InvalidValue(&pPVar3->super_ProtoWriter,type_name,SVar13);
      this->invalid_ = true;
    }
    if ((undefined1 *)resolved_type.status_.error_message_.field_2._8_8_ != local_40) {
      operator_delete((void *)resolved_type.status_.error_message_.field_2._8_8_);
    }
    if ((size_type *)resolved_type.status_._0_8_ !=
        &resolved_type.status_.error_message_._M_string_length) {
      operator_delete((void *)resolved_type.status_._0_8_);
    }
    if (uVar4 != OK) {
      return;
    }
  }
  pcVar1 = (this->type_url_)._M_dataplus._M_p;
  pTVar2 = (this->parent_->super_ProtoWriter).typeinfo_;
  size = (this->type_url_)._M_string_length;
  if ((long)size < 0) {
    StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
  }
  (*pTVar2->_vptr_TypeInfo[2])(local_78,pTVar2,pcVar1,size);
  if (local_78._0_4_ == OK) {
    std::call_once<void(&)()>((once_flag *)&writer_renderers_init_,InitRendererMap);
    iVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(renderers__abi_cxx11_,&this->type_url_);
    pp_Var9 = (TypeRenderer *)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_true>
                     ._M_cur + 0x28);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_true>
        ._M_cur == (__node_type *)0x0) {
      pp_Var9 = (TypeRenderer *)0x0;
    }
    this->well_known_type_render_ = pp_Var9;
    if (((iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_const_google::protobuf::util::converter::DataPiece_&)>,_true>
          ._M_cur != (__node_type *)0x0) ||
        (iVar5 = std::__cxx11::string::compare
                           (*(char **)(resolved_type.status_.error_message_.field_2._8_8_ + 0x58)),
        iVar5 == 0)) ||
       (iVar5 = std::__cxx11::string::compare
                          (*(char **)(resolved_type.status_.error_message_.field_2._8_8_ + 0x58)),
       iVar5 == 0)) {
      this->is_well_known_type_ = true;
    }
    this_00 = (ProtoStreamObjectWriter *)operator_new(0xf0);
    pPVar3 = this->parent_;
    ProtoStreamObjectWriter
              (this_00,(pPVar3->super_ProtoWriter).typeinfo_,
               (Type *)resolved_type.status_.error_message_.field_2._8_8_,
               &(this->output_).super_ByteSink,(pPVar3->super_ProtoWriter).listener_,
               &pPVar3->options_);
    pPVar3 = (this->ow_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
             ._M_head_impl;
    (this->ow_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
    _M_head_impl = this_00;
    if (pPVar3 != (ProtoStreamObjectWriter *)0x0) {
      (**(code **)(*(long *)&(pPVar3->super_ProtoWriter).super_StructuredObjectWriter + 8))();
    }
    if (this->is_well_known_type_ == false) {
      pPVar3 = (this->ow_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
               ._M_head_impl;
      (**(code **)(*(long *)&(pPVar3->super_ProtoWriter).super_StructuredObjectWriter + 0x10))
                (pPVar3,"",0);
    }
    pEVar10 = (this->uninterpreted_events_).
              super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->uninterpreted_events_).
        super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish != pEVar10) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        Event::Replay((Event *)((long)&pEVar10->type_ + lVar12),this);
        uVar11 = uVar11 + 1;
        pEVar10 = (this->uninterpreted_events_).
                  super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(this->uninterpreted_events_).
                       super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar10 >> 4) *
                0x6db6db6db6db6db7;
        lVar12 = lVar12 + 0x70;
      } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
    }
  }
  else {
    pPVar3 = this->parent_;
    value_00.length_._0_1_ = resolved_type.status_.error_message_._M_dataplus._M_p._0_1_;
    value_00.ptr_ = (char *)resolved_type.status_._0_8_;
    value_00.length_._1_7_ = resolved_type.status_.error_message_._M_dataplus._M_p._1_7_;
    if (resolved_type.status_.error_message_._M_dataplus._M_p._1_7_ < 0) {
      StringPiece::LogFatalSizeTooBig
                (CONCAT71(resolved_type.status_.error_message_._M_dataplus._M_p._1_7_,
                          resolved_type.status_.error_message_._M_dataplus._M_p._0_1_),
                 "size_t to int conversion");
    }
    type_name_00.length_ = 3;
    type_name_00.ptr_ = "Any";
    ProtoWriter::InvalidValue(&pPVar3->super_ProtoWriter,type_name_00,value_00);
    this->invalid_ = true;
  }
  if ((size_type *)resolved_type.status_._0_8_ !=
      &resolved_type.status_.error_message_._M_string_length) {
    operator_delete((void *)resolved_type.status_._0_8_);
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::StartAny(const DataPiece& value) {
  // Figure out the type url. This is a copy-paste from WriteString but we also
  // need the value, so we can't just call through to that.
  if (value.type() == DataPiece::TYPE_STRING) {
    type_url_ = std::string(value.str());
  } else {
    StatusOr<std::string> s = value.ToString();
    if (!s.ok()) {
      parent_->InvalidValue("String", s.status().message());
      invalid_ = true;
      return;
    }
    type_url_ = s.value();
  }
  // Resolve the type url, and report an error if we failed to resolve it.
  StatusOr<const google::protobuf::Type*> resolved_type =
      parent_->typeinfo()->ResolveTypeUrl(type_url_);
  if (!resolved_type.ok()) {
    parent_->InvalidValue("Any", resolved_type.status().message());
    invalid_ = true;
    return;
  }
  // At this point, type is never null.
  const google::protobuf::Type* type = resolved_type.value();

  well_known_type_render_ = FindTypeRenderer(type_url_);
  if (well_known_type_render_ != nullptr ||
      // Explicitly list Any and Struct here because they don't have a
      // custom renderer.
      type->name() == kAnyType || type->name() == kStructType) {
    is_well_known_type_ = true;
  }

  // Create our object writer and initialize it with the first StartObject
  // call.
  ow_.reset(new ProtoStreamObjectWriter(parent_->typeinfo(), *type, &output_,
                                        parent_->listener(),
                                        parent_->options_));

  // Don't call StartObject() for well-known types yet. Depending on the
  // type of actual data, we may not need to call StartObject(). For
  // example:
  // {
  //   "@type": "type.googleapis.com/google.protobuf.Value",
  //   "value": [1, 2, 3],
  // }
  // With the above JSON representation, we will only call StartList() on the
  // contained ow_.
  if (!is_well_known_type_) {
    ow_->StartObject("");
  }

  // Now we know the proto type and can interpret all data fields we gathered
  // before the "@type" field.
  for (int i = 0; i < uninterpreted_events_.size(); ++i) {
    uninterpreted_events_[i].Replay(this);
  }
}